

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HermiteSpline<3U,_2U> * fit_and_draw_spline<HermiteSpline<3u,2u>>(void)

{
  double *pdVar1;
  HermiteSpline<3U,_2U> *in_RDI;
  long lVar2;
  int k;
  ulong uVar3;
  HermiteSpline<3U,_2U> local_3f0;
  undefined8 local_3d0;
  Matrix<double,_2,_1,_0,_2,_1> start;
  _Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_3b0;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  Matrix<double,_2,_1,_0,_2,_1> end;
  HermiteSpline<3U,_2U> local_378;
  Vector2d local_358;
  Matrix<double,_2,_1,_0,_2,_1> local_348;
  Matrix<double,_2,_1,_0,_2,_1> local_338;
  Mat3f local_328;
  Solver solver;
  
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI->length = 0.0;
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&solver);
  solver.A.m_outerSize = 0;
  solver.A.m_innerSize = 0;
  solver.super_BaseSplineSolver<3U,_2U>._vptr_BaseSplineSolver = (_func_int **)0x0;
  solver.A.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
  solver.A._1_7_ = 0;
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc1020006;
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000001;
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&solver;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&frame,(_InputArray *)&local_3f0);
  if (0x20 < (ulong)((long)points.
                           super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)points.
                          super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    SplineSolver<3U,_2U>::SplineSolver(&solver);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&start);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&end);
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_3b0,&points);
    local_338.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = start.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
           [0];
    local_338.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = start.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
           [1];
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = end.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
           [0];
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = end.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
           [1];
    BaseSplineSolver<3U,_2U>::solve
              (&local_3f0,&solver.super_BaseSplineSolver<3U,_2U>,
               (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_3b0,&local_338,&local_348);
    HermiteSpline<3U,_2U>::operator=(in_RDI,&local_3f0);
    std::
    _Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>::
    ~_Vector_base((_Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                   *)&local_3f0);
    std::
    _Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::~_Vector_base(&local_3b0);
    HermiteSpline<3U,_2U>::HermiteSpline(&local_378,in_RDI);
    cv::Mat::Mat(&local_328.super_Mat,&frame.super_Mat);
    local_358.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = scale;
    local_358.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = scale;
    draw_spline<3u>(&local_378,&local_328,&local_358);
    cv::Mat::~Mat(&local_328.super_Mat);
    std::
    _Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>::
    ~_Vector_base((_Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                   *)&local_378);
    SplineSolver<3U,_2U>::~SplineSolver(&solver);
  }
  lVar2 = 0;
  local_398 = 0;
  uStack_394 = 0;
  uStack_390 = 0;
  uStack_38c = 0x3ff00000;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)points.
                            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)points.
                            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
    local_3f0.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f0.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x83010015;
    local_3f0.children.
    super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&frame;
    pdVar1 = (double *)
             ((long)((points.
                      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                    array + lVar2);
    local_3d0 = CONCAT44((int)(scale * pdVar1[1]),(int)(scale * *pdVar1));
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&solver);
    solver.super_BaseSplineSolver<3U,_2U>._vptr_BaseSplineSolver =
         (_func_int **)CONCAT44(uStack_394,local_398);
    solver.A._4_4_ = uStack_38c;
    solver.A._0_4_ = uStack_390;
    solver.A.m_outerSize = 0;
    solver.A.m_innerSize = 0;
    cv::circle(&local_3f0,&local_3d0,5,&solver,0xffffffff,8,0);
    lVar2 = lVar2 + 0x10;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&solver,"w1",(allocator<char> *)&start);
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x81010015;
  local_3f0.children.
  super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&frame;
  cv::imshow((string *)&solver,(_InputArray *)&local_3f0);
  std::__cxx11::string::~string((string *)&solver);
  return in_RDI;
}

Assistant:

Spline fit_and_draw_spline()
{
    Spline sp;

    frame.setTo(Scalar(0.0f,0.0f, 0.0f)); // clear frame

    if (points.size() >= 3)
    {
        typename Spline::Solver solver;

        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> start;
        Matrix<double, 2, Spline::Polynomial1::RequiredValues - 1> end;

        start.setZero();
        end.setZero();

        sp = solver.solve(points, start, end);
        draw_spline(sp, frame, Vector2d(scale, scale));
    }

    for (int k = 0; k < points.size(); ++k)
    {
        circle(frame, Point((int)(points[k].x() * scale), (int)(points[k].y() * scale)), 5.0, Scalar(0.0f, 1.0f, 0.0f), FILLED);
    }

    imshow(WINDOW1, frame);

    return sp;
}